

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.h
# Opt level: O1

void __thiscall PresolveComponentData::clear(PresolveComponentData *this)

{
  pointer pcVar1;
  pointer ppVar2;
  pointer piVar3;
  pointer puVar4;
  pointer pNVar5;
  
  (this->super_HighsComponentData).is_valid = false;
  (this->postSolveStack).debug_prev_numreductions = 0;
  (this->postSolveStack).debug_prev_col_lower = 0.0;
  (this->postSolveStack).debug_prev_col_upper = 0.0;
  (this->postSolveStack).debug_prev_row_lower = 0.0;
  (this->postSolveStack).debug_prev_row_upper = 0.0;
  pcVar1 = (this->postSolveStack).reductionValues.data.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  (this->postSolveStack).reductionValues.data.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->postSolveStack).reductionValues.data.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postSolveStack).reductionValues.data.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  (this->postSolveStack).reductionValues.position = 0;
  ppVar2 = (this->postSolveStack).reductions.
           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->postSolveStack).reductions.
  super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->postSolveStack).reductions.
  super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postSolveStack).reductions.
  super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2);
  }
  piVar3 = (this->postSolveStack).origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  (this->postSolveStack).origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->postSolveStack).origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postSolveStack).origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->postSolveStack).origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  (this->postSolveStack).origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->postSolveStack).origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postSolveStack).origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  puVar4 = (this->postSolveStack).linearlyTransformable.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->postSolveStack).linearlyTransformable.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->postSolveStack).linearlyTransformable.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->postSolveStack).linearlyTransformable.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
  }
  pNVar5 = (this->postSolveStack).rowValues.
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->postSolveStack).rowValues.
  super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->postSolveStack).rowValues.
  super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postSolveStack).rowValues.
  super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pNVar5 != (pointer)0x0) {
    operator_delete(pNVar5);
  }
  pNVar5 = (this->postSolveStack).colValues.
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->postSolveStack).colValues.
  super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->postSolveStack).colValues.
  super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postSolveStack).colValues.
  super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pNVar5 != (pointer)0x0) {
    operator_delete(pNVar5);
  }
  (this->postSolveStack).origNumCol = -1;
  (this->postSolveStack).origNumRow = -1;
  HighsLp::clear(&this->reduced_lp_);
  HighsSolution::clear(&this->recovered_solution_);
  HighsBasis::clear(&this->recovered_basis_);
  return;
}

Assistant:

void clear() {
    is_valid = false;

    postSolveStack = presolve::HighsPostsolveStack();

    reduced_lp_.clear();
    recovered_solution_.clear();
    recovered_basis_.clear();
  }